

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O2

const_iterator
deqp::gles2::Functional::UniformCase::BasicUniformReportGL::findWithName
          (vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
           *vec,char *name)

{
  bool bVar1;
  const_iterator cVar2;
  BasicUniformReportGL *__lhs;
  
  __lhs = (vec->
          super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
          )._M_impl.super__Vector_impl_data._M_start;
  while ((cVar2._M_current =
               (vec->
               super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
               )._M_impl.super__Vector_impl_data._M_finish, __lhs != cVar2._M_current &&
         (bVar1 = std::operator==(&__lhs->name,name), cVar2._M_current = __lhs, !bVar1))) {
    __lhs = __lhs + 1;
  }
  return (const_iterator)cVar2._M_current;
}

Assistant:

static vector<BasicUniformReportGL>::const_iterator findWithName (const vector<BasicUniformReportGL>& vec, const char* const name)
		{
			for (vector<BasicUniformReportGL>::const_iterator it = vec.begin(); it != vec.end(); it++)
			{
				if (it->name == name)
					return it;
			}
			return vec.end();
		}